

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

MultiIndexSet * __thiscall
TasGrid::GridGlobal::selectTensors
          (MultiIndexSet *__return_storage_ptr__,GridGlobal *this,size_t dims,int depth,
          TypeDepth type,vector<int,_std::allocator<int>_> *anisotropic_weights,TypeOneDRule crule,
          vector<int,_std::allocator<int>_> *level_limits)

{
  _Any_data *rule_exactness;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if ((type < type_iptensor) && ((0x40eU >> (type & 0x1f) & 1) != 0)) {
    rule_exactness = &local_b8;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a0 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:82:74)>
               ::_M_invoke;
    local_a8 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:82:74)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)rule_exactness,
               (vector<int,_std::allocator<int>_> *)anisotropic_weights,
               (vector<int,_std::allocator<int>_> *)level_limits);
  }
  else if (crule == rule_customtabulated) {
    if ((type < (type_qptensor|type_level)) && ((0x12a0U >> (type & 0x1f) & 1) != 0)) {
      rule_exactness = &local_30;
      local_30._8_8_ = 0;
      local_18 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:87:82)>
                 ::_M_invoke;
      local_20 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:87:82)>
                 ::_M_manager;
      local_30._M_unused._M_object = this;
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)rule_exactness,
                 (vector<int,_std::allocator<int>_> *)anisotropic_weights,
                 (vector<int,_std::allocator<int>_> *)level_limits);
    }
    else {
      rule_exactness = &local_50;
      local_50._8_8_ = 0;
      local_38 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:90:82)>
                 ::_M_invoke;
      local_40 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:90:82)>
                 ::_M_manager;
      local_50._M_unused._M_object = this;
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)rule_exactness,
                 (vector<int,_std::allocator<int>_> *)anisotropic_weights,
                 (vector<int,_std::allocator<int>_> *)level_limits);
    }
  }
  else if ((type < (type_qptensor|type_level)) && ((0x12a0U >> (type & 0x1f) & 1) != 0)) {
    rule_exactness = &local_70;
    local_70._8_8_ = 0;
    local_70._M_unused._M_object = &crule;
    local_58 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:95:82)>
               ::_M_invoke;
    local_60 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:95:82)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)rule_exactness,
               (vector<int,_std::allocator<int>_> *)anisotropic_weights,
               (vector<int,_std::allocator<int>_> *)level_limits);
  }
  else {
    rule_exactness = &local_90;
    local_90._8_8_ = 0;
    local_90._M_unused._M_object = &crule;
    local_78 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:98:82)>
               ::_M_invoke;
    local_80 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:98:82)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)rule_exactness,
               (vector<int,_std::allocator<int>_> *)anisotropic_weights,
               (vector<int,_std::allocator<int>_> *)level_limits);
  }
  ::std::_Function_base::~_Function_base((_Function_base *)rule_exactness);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridGlobal::selectTensors(size_t dims, int depth, TypeDepth type, const std::vector<int> &anisotropic_weights,
                                        TypeOneDRule crule, std::vector<int> const &level_limits) const{
    if (OneDimensionalMeta::isExactLevel(type)){ // no need to know exactness
        return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return l; },
                                                      anisotropic_weights, level_limits);
    }else{ // work with exactness specific to the rule
        if (crule == rule_customtabulated){
            if (OneDimensionalMeta::isExactQuadrature(type)){
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return custom.getQExact(l); },
                                                              anisotropic_weights, level_limits);
            }else{
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return custom.getIExact(l); },
                                                              anisotropic_weights, level_limits);
            }
        }else{ // using regular OneDimensionalMeta
            if (OneDimensionalMeta::isExactQuadrature(type)){
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return OneDimensionalMeta::getQExact(l, crule); },
                                                              anisotropic_weights, level_limits);
            }else{
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return OneDimensionalMeta::getIExact(l, crule); },
                                                              anisotropic_weights, level_limits);
            }
        }
    }
}